

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfFile.cpp
# Opt level: O1

void __thiscall ElfSegment::writeData(ElfSegment *this,ByteArray *output)

{
  Elf32_Off *pEVar1;
  Elf32_Off EVar2;
  pointer ppEVar3;
  uint uVar4;
  size_t alignment;
  ulong uVar5;
  
  ppEVar3 = (this->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  if ((this->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar3) {
    uVar4 = ((*ppEVar3)->header).sh_addralign;
    alignment = 0x10;
    if (0x10 < (int)uVar4) {
      alignment = (size_t)uVar4;
    }
    ByteArray::alignSize(output,alignment);
    EVar2 = (Elf32_Off)output->size_;
    (this->header).p_offset = EVar2;
    ppEVar3 = (this->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar4 = (uint)((ulong)((long)(this->sections).
                                 super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar3) >> 3);
    if (0 < (int)uVar4) {
      uVar5 = 0;
      do {
        pEVar1 = &(ppEVar3[uVar5]->header).sh_offset;
        *pEVar1 = *pEVar1 + EVar2;
        uVar5 = uVar5 + 1;
      } while ((uVar4 & 0x7fffffff) != uVar5);
    }
    if (this->paddrSection != (ElfSection *)0x0) {
      (this->header).p_paddr = (this->paddrSection->header).sh_offset;
    }
    ByteArray::append(output,&this->data);
    return;
  }
  ByteArray::alignSize(output,(ulong)(this->header).p_align);
  if ((this->header).p_offset == (this->header).p_paddr) {
    (this->header).p_paddr = (Elf32_Addr)output->size_;
  }
  (this->header).p_offset = (Elf32_Off)output->size_;
  return;
}

Assistant:

void ElfSegment::writeData(ByteArray& output)
{
	if (sections.size() == 0)
	{
		output.alignSize(header.p_align);
		if (header.p_offset == header.p_paddr)
			header.p_paddr = (Elf32_Addr) output.size();

		header.p_offset = (Elf32_Off) output.size();
		return;
	}

	// align segment to alignment of first section
	int align = std::max<int>(sections[0]->getAlignment(),16);
	output.alignSize(align);

	header.p_offset = (Elf32_Off) output.size();
	for (int i = 0; i < (int)sections.size(); i++)
	{
		sections[i]->setOffsetBase(header.p_offset);
	}

	if (paddrSection)
	{
		header.p_paddr = paddrSection->getOffset();
	}

	output.append(data);
}